

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConversionExpression.cpp
# Opt level: O2

Expression * __thiscall
slang::ast::Expression::convertAssignment
          (Expression *this,ASTContext *context,Type *type,Expression *expr,
          SourceRange assignmentRange,Expression **lhsExpr,
          bitmask<slang::ast::AssignFlags> *assignFlags)

{
  SymbolKind SVar1;
  Compilation *compilation;
  SourceRange sourceRange;
  SourceRange range;
  SourceRange operatorRange;
  SourceRange operatorRange_00;
  SourceRange sourceRange_00;
  Expression **ppEVar2;
  bool bVar3;
  bitwidth_t bVar4;
  bitwidth_t bVar5;
  Expression *pEVar6;
  InstanceSymbolBase *instance;
  Type *pTVar7;
  Expression *args_3;
  ValueRangeExpression *pVVar8;
  Diagnostic *diag;
  Diagnostic *diag_00;
  SourceLocation SVar9;
  SourceLocation context_00;
  DiagCode code;
  ConversionExpression **expr_00;
  SourceRange assignmentRange_00;
  ConversionExpression *local_a8;
  SourceRange assignmentRange_local;
  anon_class_24_3_290f256b finalizeType;
  Expression **lhsExpr_local;
  Expression *conn;
  Type *local_50;
  SourceRange *local_48;
  Expression ***local_40;
  bitmask<slang::ast::AssignFlags> **local_38;
  
  ppEVar2 = lhsExpr;
  SVar9 = assignmentRange.endLoc;
  assignmentRange_local.endLoc = assignmentRange.startLoc;
  context_00 = SVar9;
  assignmentRange_local.startLoc = (SourceLocation)expr;
  lhsExpr_local = (Expression **)SVar9;
  bVar3 = bad((Expression *)type);
  if (bVar3) {
    return (Expression *)type;
  }
  compilation = (Compilation *)**(undefined8 **)this;
  bVar3 = Type::isError((Type *)context);
  if (bVar3) {
    pEVar6 = badExpr(compilation,(Expression *)type);
    return pEVar6;
  }
  finalizeType.result = (Expression **)&local_a8;
  pTVar7 = (Type *)(type->super_Symbol).name._M_len;
  finalizeType.assignmentRange = &assignmentRange_local;
  local_a8 = (ConversionExpression *)type;
  finalizeType.context = (ASTContext *)this;
  bVar3 = Type::isEquivalent((Type *)context,pTVar7);
  if (bVar3) {
    convertAssignment::anon_class_24_3_290f256b::operator()(&finalizeType,pTVar7);
    bVar3 = Type::isVoid((Type *)context);
    if (bVar3) {
      sourceRange.startLoc = (SourceLocation)(type->super_Symbol).parentScope;
      sourceRange.endLoc = (SourceLocation)(type->super_Symbol).nextInScope;
      ASTContext::addDiag((ASTContext *)this,(DiagCode)0xac0007,sourceRange);
    }
    if (((ulong)this->constant & 2) != 0) {
      return &local_a8->super_Expression;
    }
    bVar3 = Type::isMatching((Type *)context,pTVar7);
    if (bVar3) {
      return &local_a8->super_Expression;
    }
    operatorRange.endLoc = assignmentRange_local.endLoc;
    operatorRange.startLoc = assignmentRange_local.startLoc;
    ConversionExpression::checkImplicitConversions
              ((ASTContext *)this,pTVar7,(Type *)context,&local_a8->super_Expression,
               (Expression *)0x0,operatorRange,Implicit);
    return &local_a8->super_Expression;
  }
  instance = ASTContext::getInstance((ASTContext *)this);
  if ((instance != (InstanceSymbolBase *)0x0) &&
     ((instance->arrayPath)._M_extent._M_extent_value != 0)) {
    bVar4 = Type::getBitWidth((Type *)context);
    bVar5 = Type::getBitWidth(pTVar7);
    if ((bVar4 != bVar5) || (bVar3 = Type::isAssignmentCompatible((Type *)context,pTVar7), !bVar3))
    {
      if (SVar9 == (SourceLocation)0x0) {
        conn = tryConnectPortArray((ASTContext *)this,(Type *)context,(Expression *)type,instance);
        if (conn != (Expression *)0x0) {
          expr_00 = (ConversionExpression **)&conn;
          goto LAB_00628f0d;
        }
      }
      else {
        conn = tryConnectPortArray((ASTContext *)this,pTVar7,*(Expression **)SVar9,instance);
        if (conn != (Expression *)0x0) {
          selfDetermined((ASTContext *)this,&conn);
          *(Expression **)SVar9 = conn;
          if (ppEVar2 != (Expression **)0x0) {
            *(byte *)ppEVar2 = *(byte *)ppEVar2 | 0x80;
          }
          expr_00 = &local_a8;
LAB_00628f0d:
          selfDetermined((ASTContext *)this,(Expression **)expr_00);
          return &(*expr_00)->super_Expression;
        }
      }
    }
  }
  bVar3 = Type::isAssignmentCompatible((Type *)context,pTVar7);
  if (bVar3) {
    bVar3 = Type::isNumeric((Type *)context);
    if ((bVar3) && (bVar3 = Type::isNumeric(pTVar7), bVar3)) {
      pTVar7 = OpInfo::binaryType(compilation,(Type *)context,pTVar7,false,true);
      bVar3 = Type::isEquivalent((Type *)context,pTVar7);
      if (bVar3) {
        convertAssignment::anon_class_24_3_290f256b::operator()(&finalizeType,(Type *)context);
        return &local_a8->super_Expression;
      }
      convertAssignment::anon_class_24_3_290f256b::operator()(&finalizeType,pTVar7);
    }
  }
  else {
    bVar3 = isImplicitlyAssignableTo((Expression *)type,compilation,(Type *)context);
    if (!bVar3) {
      SVar1 = (type->super_Symbol).kind;
      if (SVar1 == UntypedType) {
        local_48 = &assignmentRange_local;
        local_40 = &lhsExpr_local;
        local_38 = (bitmask<slang::ast::AssignFlags> **)&lhsExpr;
        pTVar7 = (Type *)(type->super_Symbol).name._M_len;
        conn = this;
        local_50 = (Type *)context;
        pEVar6 = convertAssignment::anon_class_40_5_378a8a91::operator()
                           ((anon_class_40_5_378a8a91 *)&conn,
                            (Expression *)(type->super_Symbol).originatingSyntax);
        args_3 = convertAssignment::anon_class_40_5_378a8a91::operator()
                           ((anon_class_40_5_378a8a91 *)&conn,(Expression *)type->canonical);
        pVVar8 = BumpAllocator::
                 emplace<slang::ast::ValueRangeExpression,slang::ast::Type_const&,slang::ast::ValueRangeKind&,slang::ast::Expression&,slang::ast::Expression&,slang::SourceRange&>
                           ((BumpAllocator *)compilation,pTVar7,&(type->super_Symbol).indexInScope,
                            pEVar6,args_3,(SourceRange *)&(type->super_Symbol).parentScope);
        (pVVar8->super_Expression).syntax = (ExpressionSyntax *)(type->super_Symbol).location;
        return &pVVar8->super_Expression;
      }
      if (SVar1 == QueueType) {
        assignmentRange_00.endLoc = (SourceLocation)this;
        assignmentRange_00.startLoc = assignmentRange_local.endLoc;
        bVar3 = Bitstream::canBeSource
                          ((Bitstream *)context,type,
                           (StreamingConcatenationExpression *)assignmentRange_local.startLoc,
                           assignmentRange_00,(ASTContext *)context_00);
        if (bVar3) {
          conn = (Expression *)CONCAT44(conn._4_4_,2);
          local_a8 = BumpAllocator::
                     emplace<slang::ast::ConversionExpression,slang::ast::Type_const&,slang::ast::ConversionKind,slang::ast::Expression&,slang::SourceRange&>
                               ((BumpAllocator *)compilation,(Type *)context,(ConversionKind *)&conn
                                ,&local_a8->super_Expression,
                                (SourceRange *)&((Symbol *)&local_a8->super_Expression)->parentScope
                               );
          selfDetermined((ASTContext *)this,(Expression **)&local_a8);
          return &local_a8->super_Expression;
        }
      }
      else {
        code.subsystem = Expressions;
        code.code = 0x1d;
        if ((((ulong)this->constant & 0x10000000) == 0) &&
           ((bVar3 = Type::isCastCompatible((Type *)context,pTVar7), bVar3 ||
            (bVar3 = Type::isBitstreamCastable((Type *)context,pTVar7), bVar3)))) {
          code.subsystem = Expressions;
          code.code = 0x7f;
        }
        sourceRange_00.endLoc = assignmentRange_local.endLoc;
        sourceRange_00.startLoc = assignmentRange_local.startLoc;
        diag = ASTContext::addDiag((ASTContext *)this,code,sourceRange_00);
        diag_00 = ast::operator<<(diag,pTVar7);
        ast::operator<<(diag_00,(Type *)context);
        if (SVar9 != (SourceLocation)0x0) {
          Diagnostic::operator<<(diag,*(SourceRange *)(*(long *)SVar9 + 0x20));
        }
        range.startLoc = (SourceLocation)(type->super_Symbol).parentScope;
        range.endLoc = (SourceLocation)(type->super_Symbol).nextInScope;
        Diagnostic::operator<<(diag,range);
      }
      pEVar6 = badExpr(compilation,(Expression *)type);
      return pEVar6;
    }
  }
  operatorRange_00.endLoc = assignmentRange_local.endLoc;
  operatorRange_00.startLoc = assignmentRange_local.startLoc;
  pEVar6 = ConversionExpression::makeImplicit
                     ((ASTContext *)this,(Type *)context,Implicit,&local_a8->super_Expression,
                      (Expression *)0x0,operatorRange_00);
  return pEVar6;
}

Assistant:

Expression& Expression::convertAssignment(const ASTContext& context, const Type& type,
                                          Expression& expr, SourceRange assignmentRange,
                                          Expression** lhsExpr, bitmask<AssignFlags>* assignFlags) {
    if (expr.bad())
        return expr;

    Compilation& comp = context.getCompilation();
    if (type.isError())
        return badExpr(comp, &expr);

    Expression* result = &expr;
    const Type* rt = expr.type;

    auto finalizeType = [&](const Type& t) {
        contextDetermined(context, result, nullptr, t, assignmentRange, ConversionKind::Implicit);
    };

    if (type.isEquivalent(*rt)) {
        finalizeType(*rt);

        if (type.isVoid())
            context.addDiag(diag::VoidAssignment, expr.sourceRange);

        // If the types are not actually matching we might still want
        // to issue conversion warnings.
        if (!context.inUnevaluatedBranch() && !type.isMatching(*rt)) {
            ConversionExpression::checkImplicitConversions(context, *rt, type, *result, nullptr,
                                                           assignmentRange,
                                                           ConversionKind::Implicit);
        }

        return *result;
    }

    // If this is a port connection to an array of instances, check if the provided
    // expression represents an array that should be sliced on a per-instance basis.
    auto instance = context.getInstance();
    if (instance && !instance->arrayPath.empty()) {
        // If the connection is already of the right size and simply differs in
        // terms of four-statedness or signedness, don't bother trying to slice
        // out the connection.
        if (type.getBitWidth() != rt->getBitWidth() || !type.isAssignmentCompatible(*rt)) {
            // If we have an lhsExpr here, this is an output (or inout) port being connected.
            // We need to pass the lhs in as the expression to be connected, since we can't
            // slice the port side. If lhsExpr is null, this is an input port and we should
            // slice the incoming expression as an rvalue.
            if (lhsExpr) {
                Expression* conn = tryConnectPortArray(context, *rt, **lhsExpr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    *lhsExpr = conn;

                    SLANG_ASSERT(assignFlags);
                    if (assignFlags)
                        *assignFlags |= AssignFlags::SlicedPort;

                    selfDetermined(context, result);
                    return *result;
                }
            }
            else {
                Expression* conn = tryConnectPortArray(context, type, expr, *instance);
                if (conn) {
                    selfDetermined(context, conn);
                    return *conn;
                }
            }
        }
    }

    if (!type.isAssignmentCompatible(*rt)) {
        if (expr.isImplicitlyAssignableTo(comp, type)) {
            return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit,
                                                      *result, nullptr, assignmentRange);
        }

        if (expr.kind == ExpressionKind::Streaming) {
            if (Bitstream::canBeSource(type, expr.as<StreamingConcatenationExpression>(),
                                       assignmentRange, context)) {
                // Add an implicit bit-stream casting otherwise types are not assignment compatible.
                // The size rule is not identical to explicit bit-stream casting so a different
                // ConversionKind is used.
                result = comp.emplace<ConversionExpression>(type, ConversionKind::StreamingConcat,
                                                            *result, result->sourceRange);
                selfDetermined(context, result);
                return *result;
            }
            return badExpr(comp, &expr);
        }

        if (expr.kind == ExpressionKind::ValueRange) {
            // Convert each side of the range and return that as a new range.
            auto convert = [&](Expression& expr) -> Expression& {
                if (expr.kind == ExpressionKind::UnboundedLiteral)
                    return expr;
                return convertAssignment(context, type, expr, assignmentRange, lhsExpr,
                                         assignFlags);
            };

            auto& vre = expr.as<ValueRangeExpression>();
            result = comp.emplace<ValueRangeExpression>(*expr.type, vre.rangeKind,
                                                        convert(vre.left()), convert(vre.right()),
                                                        expr.sourceRange);
            result->syntax = expr.syntax;
            return *result;
        }

        DiagCode code = diag::BadAssignment;
        if (!context.flags.has(ASTFlags::OutputArg) &&
            (type.isCastCompatible(*rt) || type.isBitstreamCastable(*rt))) {
            code = diag::NoImplicitConversion;
        }

        auto& diag = context.addDiag(code, assignmentRange);
        diag << *rt << type;
        if (lhsExpr)
            diag << (*lhsExpr)->sourceRange;

        diag << expr.sourceRange;
        return badExpr(comp, &expr);
    }

    if (type.isNumeric() && rt->isNumeric()) {
        // The "signednessFromRt" flag is important here; only the width of the lhs is
        // propagated down to operands, not the sign flag. Once the expression is appropriately
        // sized, the makeImplicit call down below will convert the sign for us.
        rt = OpInfo::binaryType(comp, &type, rt, false, /* signednessFromRt */ true);

        // If the final type is the same type (or equivalent) of the lhs, we know we're
        // performing an expansion of the rhs. The propagation performed by contextDetermined
        // will ensure that the expression has the correct resulting type, so we don't need an
        // additional implicit conversion. What's not obvious here is that simple assignments like:
        //      logic [3:0] a;
        //      logic [8:0] b;
        //      initial b = a;
        // will still result in an appropriate conversion warning because the type propagation
        // visitor will see that we're in an assignment and insert an implicit conversion for us.
        if (type.isEquivalent(*rt)) {
            finalizeType(type);
            return *result;
        }

        // Otherwise use the common type and fall through to get an implicit conversion
        // created for us.
        finalizeType(*rt);
    }

    return ConversionExpression::makeImplicit(context, type, ConversionKind::Implicit, *result,
                                              nullptr, assignmentRange);
}